

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translator.cpp
# Opt level: O3

void __thiscall Translator::visit(Translator *this,FormalListNode *formalListNode)

{
  byte bVar1;
  FormalListNode *formalListNodeAUX;
  
  if (formalListNode != (FormalListNode *)0x0) {
    do {
      if (((formalListNode->type->id->token == 10) ||
          (formalListNode->pointer != (PointerNode *)0x0)) ||
         (formalListNode->array != (ArrayNode *)0x0)) {
        bVar1 = 1;
      }
      else {
        bVar1 = 0;
      }
      (**(this->currentFrame->super_Frame)._vptr_Frame)
                (this->currentFrame,(ulong)bVar1,(ulong)(uint)formalListNode->id->size);
      formalListNode = formalListNode->next;
    } while (formalListNode != (FormalListNode *)0x0);
  }
  return;
}

Assistant:

void Translator::visit(FormalListNode *formalListNode) {
    FormalListNode *formalListNodeAUX = formalListNode;
    bool escape;
    while (formalListNodeAUX) {
        escape = false;
        // se for id, ponteiro ou arranjo ele escapa
        if ((formalListNodeAUX->getType()->getType() && formalListNodeAUX->getParameterType() == ID) ||
            (formalListNodeAUX->getPointer()) || (formalListNodeAUX->getArray())) {
            escape = true;
        }
        this->currentFrame->addParam(escape, formalListNodeAUX->getId()->getSize());//TODO get size ou offset?
        formalListNodeAUX = formalListNodeAUX->getNext();
    }
}